

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O0

int main(int argc,char **argv)

{
  int eval;
  int iVar1;
  FILE *in_RSI;
  int in_EDI;
  int c;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  lafe_setprogname((char *)in_RSI,
                   (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  do {
    eval = getopt(in_EDI,(char **)in_RSI,"h-");
    if (eval == -1) {
      bsdcat_next();
      if (_optind < in_EDI) {
        while (_optind < in_EDI) {
          bsdcat_current_path = *(char **)(&in_RSI->_flags + (long)_optind * 2);
          _optind = _optind + 1;
          bsdcat_read_to_stdout((char *)0x1067fe);
          bsdcat_next();
        }
      }
      else {
        bsdcat_current_path = "<stdin>";
        bsdcat_read_to_stdout((char *)0x1067b5);
      }
      exit(exit_status);
    }
    if (eval == 0x2d) {
      iVar1 = strcmp(*(char **)(&in_RSI->_flags + (long)_optind * 2),"--version");
      if (iVar1 == 0) {
        version();
      }
      iVar1 = strcmp(*(char **)(&in_RSI->_flags + (long)_optind * 2),"--help");
      if (iVar1 != 0) {
        lafe_warnc(0,"invalid option -- \'%s\'",*(undefined8 *)(&in_RSI->_flags + (long)_optind * 2)
                  );
        usage(in_RSI,eval);
      }
LAB_00106760:
      usage(in_RSI,eval);
    }
    else if (eval == 0x68) goto LAB_00106760;
    usage(in_RSI,eval);
  } while( true );
}

Assistant:

int
main(int argc, char **argv)
{
	int c;

	lafe_setprogname(*argv, "bsdcat");

	while ((c = getopt(argc, argv, "h-")) != -1) {
		switch (c) {
			case '-':
				if (strcmp(argv[optind], "--version") == 0)
					version();
				if (strcmp(argv[optind], "--help") != 0) {
					lafe_warnc(0, "invalid option -- '%s'", argv[optind]);
					usage(stderr, 1);
				}
			case 'h':
				usage(stdout, 0);
			default:
				usage(stderr, 1);
		}
	}

	bsdcat_next();
	if (optind >= argc) {
		bsdcat_current_path = "<stdin>";
		bsdcat_read_to_stdout(NULL);
	} else
		while (optind < argc) {
			bsdcat_current_path = argv[optind++];
			bsdcat_read_to_stdout(bsdcat_current_path);
			bsdcat_next();
		}

	exit(exit_status);
}